

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall Assimp::NFFImporter::ShadingInfo::ShadingInfo(ShadingInfo *this)

{
  (this->color).r = 0.6;
  (this->color).g = 0.6;
  *(undefined8 *)&(this->color).b = 0x3f8000003f19999a;
  (this->diffuse).g = 1.0;
  (this->diffuse).b = 1.0;
  (this->specular).r = 1.0;
  (this->specular).g = 1.0;
  (this->specular).b = 1.0;
  (this->emissive).g = 0.0;
  (this->emissive).b = 0.0;
  (this->ambient).r = 0.0;
  (this->ambient).g = 0.0;
  *(undefined8 *)&(this->ambient).b = 0;
  this->refracti = 1.0;
  (this->texFile)._M_dataplus._M_p = (pointer)&(this->texFile).field_2;
  (this->texFile)._M_string_length = 0;
  (this->texFile).field_2._M_local_buf[0] = '\0';
  this->twoSided = false;
  this->shaded = true;
  this->opacity = 1.0;
  this->shininess = 0.0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->mapping = aiTextureMapping_UV;
  return;
}

Assistant:

aiColor3D (ai_real _r, ai_real _g, ai_real _b) : r(_r), g(_g), b(_b) {}